

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

int __thiscall CVmObjClass::is_instance_of(CVmObjClass *this,vm_obj_id_t obj)

{
  int iVar1;
  vm_meta_entry_t *pvVar2;
  
  pvVar2 = get_meta_entry(this);
  if (pvVar2 != (vm_meta_entry_t *)0x0) {
    iVar1 = (*pvVar2->meta_->_vptr_CVmMetaclass[10])(pvVar2->meta_,obj);
    return iVar1;
  }
  return 0;
}

Assistant:

int CVmObjClass::is_instance_of(VMG_ vm_obj_id_t obj)
{
    /* get my metaclass table entry */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);

    /* if we have a valid entry, ask the metaclass object */
    if (entry != 0)
    {
        /* ask the metaclass if it's an instance of the given object */
        return entry->meta_->is_meta_instance_of(vmg_ obj);
    }
    else
    {
        /* not a valid metaclass - we can't make sense of this */
        return FALSE;
    }
}